

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_older_than.c
# Opt level: O0

void test_option_older_than(void)

{
  stat_conflict st;
  char *in_stack_ffffffffffffff68;
  char *pcVar1;
  undefined4 in_stack_ffffffffffffff70;
  wchar_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  
  assertion_make_dir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                     L'\0');
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  assertion_make_dir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                     L'\0');
  assertion_make_dir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                     L'\0');
  assertion_make_file(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  assertion_make_file(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  stat("old.txt",(stat *)&stack0xffffffffffffff70);
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x113ec5,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  sleepUntilAfter(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  assertion_make_file(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  stat("middle.txt",(stat *)&stack0xffffffffffffff70);
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x113f34,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  sleepUntilAfter(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  assertion_make_file(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  assertion_make_file(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  systemf("%s --format pax -cf ../test1.tar --older-than middle.txt *.txt a",testprog);
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x113fd8,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  systemf("%s --format pax -cf ../test2.tar *.txt a",testprog);
  pcVar1 = (char *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x11401e,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_make_dir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1,L'\0');
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  systemf("%s xf ../test1.tar",testprog);
  pcVar1 = (char *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x1140b1,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_make_dir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1,L'\0');
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  systemf("%s xf ../test2.tar --older-than ../test1in/middle.txt",testprog);
  pcVar1 = (char *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      (longlong)in_stack_ffffffffffffff78,
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                      (char *)0x1141bc,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_not_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_file_exists(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  assertion_chdir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,pcVar1);
  return;
}

Assistant:

DEFINE_TEST(test_option_older_than)
{
	struct stat st;

	/*
	 * Basic test of --older-than.
	 * First, create three files with different mtimes.
	 * Create test1.tar with --older-than, test2.tar without.
	 */
	assertMakeDir("test1in", 0755);
	assertChdir("test1in");
	assertMakeDir("a", 0755);
	assertMakeDir("a/b", 0755);
	assertMakeFile("old.txt", 0644, "old.txt");
	assertMakeFile("a/b/old.txt", 0644, "old file in old directory");
	assertEqualInt(0, stat("old.txt", &st));
	sleepUntilAfter(st.st_mtime);
	assertMakeFile("middle.txt", 0644, "middle.txt");
	assertEqualInt(0, stat("middle.txt", &st));
	sleepUntilAfter(st.st_mtime);
	assertMakeFile("new.txt", 0644, "new");
	assertMakeFile("a/b/new.txt", 0644, "new file in old directory");

	/* Test --older-than on create */
	assertEqualInt(0,
		systemf("%s --format pax -cf ../test1.tar "
			"--older-than middle.txt *.txt a",
			testprog));
	assertEqualInt(0,
		systemf("%s --format pax -cf ../test2.tar *.txt a",
			testprog));
	assertChdir("..");

	/* Extract test1.tar to a clean dir and verify what got archived. */
	assertMakeDir("test1out", 0755);
	assertChdir("test1out");
	assertEqualInt(0, systemf("%s xf ../test1.tar", testprog));
	assertFileNotExists("new.txt");
	assertFileNotExists("a/b/new.txt");
	assertFileNotExists("middle.txt");
	assertFileExists("old.txt");
	assertFileExists("a/b/old.txt");
	assertChdir("..");

	/* Extract test2.tar to a clean dir with --older-than and verify. */
	assertMakeDir("test2out", 0755);
	assertChdir("test2out");
	assertEqualInt(0,
		systemf("%s xf ../test2.tar --older-than ../test1in/middle.txt",
			testprog));
	assertFileNotExists("new.txt");
	assertFileNotExists("a/b/new.txt");
	assertFileNotExists("middle.txt");
	assertFileExists("old.txt");
	assertFileExists("a/b/old.txt");
	assertChdir("..");
}